

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
geometrycentral::
applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          geometrycentral *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *sourceData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  pointer puVar4;
  unsigned_long uVar5;
  ulong uVar6;
  allocator_type local_19;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)(sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  puVar1 = (sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = *(long *)this;
  puVar4 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar6 < (ulong)((long)puVar2 - (long)puVar1 >> 3); uVar6 = uVar6 + 1) {
    uVar5 = puVar1[uVar6];
    if (uVar5 != 0xffffffffffffffff) {
      puVar4[uVar6] = *(unsigned_long *)(lVar3 + uVar5 * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T, A1> applyPermutation(const std::vector<T, A1>& sourceData, const std::vector<size_t, A2>& permNewToOld) {
  std::vector<T, A1> retVal(permNewToOld.size());
  for (size_t i = 0; i < permNewToOld.size(); i++) {
    if (permNewToOld[i] != INVALID_IND) {
      retVal[i] = sourceData[permNewToOld[i]];
    }
  }
  return retVal;
}